

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

Vec_Ptr_t * Aig_ManDfsArray(Aig_Man_t *p,Aig_Obj_t **pNodes,int nNodes)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  
  Aig_ManIncrementTravId(p);
  iVar1 = p->vObjs->nSize;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar2 = 8;
  if (6 < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  vNodes->nCap = iVar2;
  if (iVar2 == 0) {
    pAVar4 = p->pConst1;
    pAVar4->TravId = p->nTravIds;
    ppvVar3 = (void **)malloc(0x80);
    vNodes->pArray = ppvVar3;
    vNodes->nCap = 0x10;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar2 << 3);
    vNodes->pArray = ppvVar3;
    pAVar4 = p->pConst1;
    pAVar4->TravId = p->nTravIds;
  }
  vNodes->nSize = 1;
  *ppvVar3 = pAVar4;
  if (0 < nNodes) {
    uVar5 = 0;
    do {
      Aig_ManDfsAll_rec(p,pNodes[uVar5],vNodes);
      uVar5 = uVar5 + 1;
    } while ((uint)nNodes != uVar5);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsArray( Aig_Man_t * p, Aig_Obj_t ** pNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    int i;
    Aig_ManIncrementTravId( p );
    vNodes = Vec_PtrAlloc( Aig_ManObjNumMax(p) );
    // add constant
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Vec_PtrPush( vNodes, Aig_ManConst1(p) );
    // collect nodes reachable in the DFS order
    for ( i = 0; i < nNodes; i++ )
        Aig_ManDfsAll_rec( p, pNodes[i], vNodes );
    return vNodes;
}